

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

system_error * fmt::v8::vsystem_error(int error_code,string_view format_str,format_args args)

{
  error_category *__cat;
  undefined4 in_register_0000003c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar1;
  error_code __ec;
  format_args args_00;
  string local_78;
  ulong local_58;
  error_category *peStack_50;
  undefined1 auStack_48 [8];
  error_code ec;
  int error_code_local;
  format_args args_local;
  string_view format_str_local;
  
  aVar1 = in_R9;
  ec._M_cat._4_4_ = (int)format_str.data_;
  __cat = (error_category *)std::_V2::generic_category();
  std::error_code::error_code((error_code *)auStack_48,(int)format_str.data_,__cat);
  local_58 = (ulong)auStack_48;
  peStack_50 = (error_category *)ec._0_8_;
  args_00.field_1.values_ = aVar1.values_;
  args_00.desc_ = (unsigned_long_long)in_R9.values_;
  vformat_abi_cxx11_(&local_78,(v8 *)format_str.size_,(string_view)args,args_00);
  __ec._0_8_ = local_58 & 0xffffffff;
  __ec._M_cat = peStack_50;
  std::system_error::system_error
            ((system_error *)CONCAT44(in_register_0000003c,error_code),__ec,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return (system_error *)CONCAT44(in_register_0000003c,error_code);
}

Assistant:

FMT_FUNC std::system_error vsystem_error(int error_code, string_view format_str,
                                         format_args args) {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(format_str, args));
}